

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void solve_l2r_l1l2_svr(problem *prob,double *w,parameter *param,int solver_type)

{
  feature_node *pfVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  uint local_124;
  double dStack_120;
  int nSV;
  double v;
  double beta_old;
  double violation;
  double Gn;
  double Gp;
  double val_1;
  feature_node *pfStack_e8;
  int ind;
  feature_node *xi_1;
  int j;
  double val;
  feature_node *xi;
  double upper_bound [1];
  double lambda [1];
  double *y;
  double *QD;
  double *beta;
  double Gnorm1_init;
  double Gnorm1_new;
  double Gmax_new;
  double Gmax_old;
  double H;
  double G;
  double d;
  int *index;
  int active_size;
  int max_iter;
  int iter;
  int s;
  int i;
  double eps;
  int w_size;
  double p;
  double C;
  int l;
  int solver_type_local;
  parameter *param_local;
  double *w_local;
  problem *prob_local;
  
  iVar4 = prob->l;
  pfVar1 = (feature_node *)param->C;
  dVar2 = param->p;
  iVar5 = prob->n;
  dVar3 = param->eps;
  active_size = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)iVar4;
  uVar11 = SUB168(auVar7 * ZEXT816(4),0);
  if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar12 = operator_new__(uVar11);
  Gmax_new = INFINITY;
  beta = (double *)0xbff0000000000000;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)iVar4;
  uVar11 = SUB168(auVar8 * ZEXT816(8),0);
  if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar11);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (long)iVar4;
  uVar11 = SUB168(auVar9 * ZEXT816(8),0);
  if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar14 = operator_new__(uVar11);
  pdVar6 = prob->y;
  upper_bound[0] = 0.5 / (double)pfVar1;
  xi = (feature_node *)0x7ff0000000000000;
  if (solver_type == 0xd) {
    upper_bound[0] = 0.0;
    xi = pfVar1;
  }
  for (iter = 0; iter < iVar4; iter = iter + 1) {
    *(undefined8 *)((long)pvVar13 + (long)iter * 8) = 0;
  }
  for (iter = 0; iter < iVar5; iter = iter + 1) {
    w[iter] = 0.0;
  }
  for (iter = 0; index._4_4_ = iVar4, iter < iVar4; iter = iter + 1) {
    *(undefined8 *)((long)pvVar14 + (long)iter * 8) = 0;
    for (val = (double)prob->x[iter]; *(int *)val != -1; val = (double)((long)val + 0x10)) {
      dVar15 = *(double *)((long)val + 8);
      *(double *)((long)pvVar14 + (long)iter * 8) =
           dVar15 * dVar15 + *(double *)((long)pvVar14 + (long)iter * 8);
      w[*(int *)val + -1] =
           *(double *)((long)pvVar13 + (long)iter * 8) * dVar15 + w[*(int *)val + -1];
    }
    *(int *)((long)pvVar12 + (long)iter * 4) = iter;
  }
  while (active_size < 1000) {
    Gnorm1_new = 0.0;
    Gnorm1_init = 0.0;
    for (iter = 0; iter < index._4_4_; iter = iter + 1) {
      iVar10 = rand();
      swap<int>((int *)((long)pvVar12 + (long)iter * 4),
                (int *)((long)pvVar12 + (long)(iter + iVar10 % (index._4_4_ - iter)) * 4));
    }
    for (max_iter = 0; max_iter < index._4_4_; max_iter = max_iter + 1) {
      iVar10 = *(int *)((long)pvVar12 + (long)max_iter * 4);
      H = upper_bound[0] * *(double *)((long)pvVar13 + (long)iVar10 * 8) + -pdVar6[iVar10];
      dVar15 = *(double *)((long)pvVar14 + (long)iVar10 * 8) + upper_bound[0];
      for (pfStack_e8 = prob->x[iVar10]; pfStack_e8->index != -1; pfStack_e8 = pfStack_e8 + 1) {
        H = pfStack_e8->value * w[pfStack_e8->index + -1] + H;
      }
      dVar16 = H + dVar2;
      dVar17 = H - dVar2;
      beta_old = 0.0;
      dVar18 = *(double *)((long)pvVar13 + (long)iVar10 * 8);
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        if (*(double *)((long)pvVar13 + (long)iVar10 * 8) < (double)xi) {
          if (-(double)xi < *(double *)((long)pvVar13 + (long)iVar10 * 8)) {
            dVar18 = dVar17;
            if (0.0 < *(double *)((long)pvVar13 + (long)iVar10 * 8)) {
              dVar18 = dVar16;
            }
            beta_old = ABS(dVar18);
            dVar18 = beta_old;
          }
          else if (0.0 <= dVar17) {
            dVar18 = beta_old;
            if (Gmax_new < dVar17) {
              index._4_4_ = index._4_4_ + -1;
              swap<int>((int *)((long)pvVar12 + (long)max_iter * 4),
                        (int *)((long)pvVar12 + (long)index._4_4_ * 4));
              max_iter = max_iter + -1;
              goto LAB_0010e5e3;
            }
          }
          else {
            dVar18 = -dVar17;
          }
        }
        else {
          dVar18 = dVar16;
          if ((dVar16 <= 0.0) && (dVar18 = beta_old, dVar16 < -Gmax_new)) {
            index._4_4_ = index._4_4_ + -1;
            swap<int>((int *)((long)pvVar12 + (long)max_iter * 4),
                      (int *)((long)pvVar12 + (long)index._4_4_ * 4));
            max_iter = max_iter + -1;
            goto LAB_0010e5e3;
          }
        }
LAB_0010e3b3:
        beta_old = dVar18;
        Gnorm1_new = max<double>(Gnorm1_new,beta_old);
        Gnorm1_init = beta_old + Gnorm1_init;
        if (dVar15 * *(double *)((long)pvVar13 + (long)iVar10 * 8) <= dVar16) {
          if (dVar17 <= dVar15 * *(double *)((long)pvVar13 + (long)iVar10 * 8)) {
            G = -*(double *)((long)pvVar13 + (long)iVar10 * 8);
          }
          else {
            G = -dVar17 / dVar15;
          }
        }
        else {
          G = -dVar16 / dVar15;
        }
        if (1e-12 <= ABS(G)) {
          dVar15 = *(double *)((long)pvVar13 + (long)iVar10 * 8);
          dVar18 = max<double>(*(double *)((long)pvVar13 + (long)iVar10 * 8) + G,-(double)xi);
          dVar18 = min<double>(dVar18,(double)xi);
          *(double *)((long)pvVar13 + (long)iVar10 * 8) = dVar18;
          dVar15 = *(double *)((long)pvVar13 + (long)iVar10 * 8) - dVar15;
          if ((dVar15 != 0.0) || (NAN(dVar15))) {
            for (pfStack_e8 = prob->x[iVar10]; pfStack_e8->index != -1; pfStack_e8 = pfStack_e8 + 1)
            {
              iVar10 = pfStack_e8->index + -1;
              w[iVar10] = dVar15 * pfStack_e8->value + w[iVar10];
            }
          }
        }
      }
      else {
        if (dVar16 < 0.0) {
          dVar18 = -dVar16;
          goto LAB_0010e3b3;
        }
        dVar18 = dVar17;
        if (((0.0 < dVar17) || (dVar18 = beta_old, dVar16 <= Gmax_new)) || (-Gmax_new <= dVar17))
        goto LAB_0010e3b3;
        index._4_4_ = index._4_4_ + -1;
        swap<int>((int *)((long)pvVar12 + (long)max_iter * 4),
                  (int *)((long)pvVar12 + (long)index._4_4_ * 4));
        max_iter = max_iter + -1;
      }
LAB_0010e5e3:
    }
    if (active_size == 0) {
      beta = (double *)Gnorm1_init;
    }
    active_size = active_size + 1;
    if (active_size % 10 == 0) {
      info(".");
    }
    if (Gnorm1_init <= dVar3 * (double)beta) {
      if (index._4_4_ == iVar4) break;
      info("*");
      Gmax_new = INFINITY;
      index._4_4_ = iVar4;
    }
    else {
      Gmax_new = Gnorm1_new;
    }
  }
  info("\noptimization finished, #iter = %d\n",(ulong)(uint)active_size);
  if (999 < active_size) {
    info("\nWARNING: reaching max number of iterations\nUsing -s 11 may be faster\n\n");
  }
  dStack_120 = 0.0;
  local_124 = 0;
  for (iter = 0; iter < iVar5; iter = iter + 1) {
    dStack_120 = w[iter] * w[iter] + dStack_120;
  }
  dStack_120 = dStack_120 * 0.5;
  for (iter = 0; iter < iVar4; iter = iter + 1) {
    dStack_120 = upper_bound[0] * 0.5 * *(double *)((long)pvVar13 + (long)iter * 8) *
                 *(double *)((long)pvVar13 + (long)iter * 8) +
                 dVar2 * ABS(*(double *)((long)pvVar13 + (long)iter * 8)) +
                 -(pdVar6[iter] * *(double *)((long)pvVar13 + (long)iter * 8)) + dStack_120;
    dVar3 = *(double *)((long)pvVar13 + (long)iter * 8);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      local_124 = local_124 + 1;
    }
  }
  info("Objective value = %lf\n",dStack_120);
  info("nSV = %d\n",(ulong)local_124);
  if (pvVar13 != (void *)0x0) {
    operator_delete__(pvVar13);
  }
  if (pvVar14 != (void *)0x0) {
    operator_delete__(pvVar14);
  }
  if (pvVar12 != (void *)0x0) {
    operator_delete__(pvVar12);
  }
  return;
}

Assistant:

static void solve_l2r_l1l2_svr(
	const problem *prob, double *w, const parameter *param,
	int solver_type)
{
	int l = prob->l;
	double C = param->C;
	double p = param->p;
	int w_size = prob->n;
	double eps = param->eps;
	int i, s, iter = 0;
	int max_iter = 1000;
	int active_size = l;
	int *index = new int[l];

	double d, G, H;
	double Gmax_old = INF;
	double Gmax_new, Gnorm1_new;
	double Gnorm1_init = -1.0; // Gnorm1_init is initialized at the first iteration
	double *beta = new double[l];
	double *QD = new double[l];
	double *y = prob->y;

	// L2R_L2LOSS_SVR_DUAL
	double lambda[1], upper_bound[1];
	lambda[0] = 0.5/C;
	upper_bound[0] = INF;

	if(solver_type == L2R_L1LOSS_SVR_DUAL)
	{
		lambda[0] = 0;
		upper_bound[0] = C;
	}

	// Initial beta can be set here. Note that
	// -upper_bound <= beta[i] <= upper_bound
	for(i=0; i<l; i++)
		beta[i] = 0;

	for(i=0; i<w_size; i++)
		w[i] = 0;
	for(i=0; i<l; i++)
	{
		QD[i] = 0;
		feature_node *xi = prob->x[i];
		while(xi->index != -1)
		{
			double val = xi->value;
			QD[i] += val*val;
			w[xi->index-1] += beta[i]*val;
			xi++;
		}

		index[i] = i;
	}


	while(iter < max_iter)
	{
		Gmax_new = 0;
		Gnorm1_new = 0;

		for(i=0; i<active_size; i++)
		{
			int j = i+rand()%(active_size-i);
			swap(index[i], index[j]);
		}

		for(s=0; s<active_size; s++)
		{
			i = index[s];
			G = -y[i] + lambda[GETI(i)]*beta[i];
			H = QD[i] + lambda[GETI(i)];

			feature_node *xi = prob->x[i];
			while(xi->index != -1)
			{
				int ind = xi->index-1;
				double val = xi->value;
				G += val*w[ind];
				xi++;
			}

			double Gp = G+p;
			double Gn = G-p;
			double violation = 0;
			if(beta[i] == 0)
			{
				if(Gp < 0)
					violation = -Gp;
				else if(Gn > 0)
					violation = Gn;
				else if(Gp>Gmax_old && Gn<-Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] >= upper_bound[GETI(i)])
			{
				if(Gp > 0)
					violation = Gp;
				else if(Gp < -Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] <= -upper_bound[GETI(i)])
			{
				if(Gn < 0)
					violation = -Gn;
				else if(Gn > Gmax_old)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}
			}
			else if(beta[i] > 0)
				violation = fabs(Gp);
			else
				violation = fabs(Gn);

			Gmax_new = max(Gmax_new, violation);
			Gnorm1_new += violation;

			// obtain Newton direction d
			if(Gp < H*beta[i])
				d = -Gp/H;
			else if(Gn > H*beta[i])
				d = -Gn/H;
			else
				d = -beta[i];

			if(fabs(d) < 1.0e-12)
				continue;

			double beta_old = beta[i];
			beta[i] = min(max(beta[i]+d, -upper_bound[GETI(i)]), upper_bound[GETI(i)]);
			d = beta[i]-beta_old;

			if(d != 0)
			{
				xi = prob->x[i];
				while(xi->index != -1)
				{
					w[xi->index-1] += d*xi->value;
					xi++;
				}
			}
		}

		if(iter == 0)
			Gnorm1_init = Gnorm1_new;
		iter++;
		if(iter % 10 == 0)
			info(".");

		if(Gnorm1_new <= eps*Gnorm1_init)
		{
			if(active_size == l)
				break;
			else
			{
				active_size = l;
				info("*");
				Gmax_old = INF;
				continue;
			}
		}

		Gmax_old = Gmax_new;
	}

	info("\noptimization finished, #iter = %d\n", iter);
	if(iter >= max_iter)
		info("\nWARNING: reaching max number of iterations\nUsing -s 11 may be faster\n\n");

	// calculate objective value
	double v = 0;
	int nSV = 0;
	for(i=0; i<w_size; i++)
		v += w[i]*w[i];
	v = 0.5*v;
	for(i=0; i<l; i++)
	{
		v += p*fabs(beta[i]) - y[i]*beta[i] + 0.5*lambda[GETI(i)]*beta[i]*beta[i];
		if(beta[i] != 0)
			nSV++;
	}

	info("Objective value = %lf\n", v);
	info("nSV = %d\n",nSV);

	delete [] beta;
	delete [] QD;
	delete [] index;
}